

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O0

void leader_speaks(monst *mtmp)

{
  boolean bVar1;
  monst *mtmp_local;
  
  if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
    if (((uint)quest_status._0_4_ >> 5 & 1) == 0) {
      qt_pager(0x12);
    }
    quest_status._0_4_ = quest_status._0_4_ & 0xffffffdf | 0x20;
    mtmp->mstrategy = mtmp->mstrategy & 0xcfffffff;
  }
  bVar1 = on_level(&u.uz,&dungeon_topology.d_qstart_level);
  if (bVar1 != '\0') {
    if (((uint)quest_status._0_4_ >> 5 & 1) == 0) {
      chat_with_leader();
    }
    if (((uint)quest_status._0_4_ >> 5 & 1) != 0) {
      mtmp->mstrategy = mtmp->mstrategy & 0xcfffffff;
      *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbfffff;
    }
  }
  return;
}

Assistant:

void leader_speaks(struct monst *mtmp)
{
	/* maybe you attacked leader? */
	if (!mtmp->mpeaceful) {
	    if (!Qstat(pissed_off)) {
		/* again, don't end it permanently if the leader gets angry
		 * since you're going to have to kill him to go questing... :)
		 * ...but do only show this crap once. */
		qt_pager(QT_LASTLEADER);
	    }
	    Qstat(pissed_off) = TRUE;
	    mtmp->mstrategy &= ~STRAT_WAITMASK;	/* end the inaction */
	}
	/* the quest leader might have passed through the portal into the
	   regular dungeon; if so, mustn't perform "backwards expulsion" */
	if (!on_level(&u.uz, &qstart_level)) return;

	if (!Qstat(pissed_off)) chat_with_leader();

	/* leader might have become pissed during the chat */
	if (Qstat(pissed_off)) {
	    mtmp->mstrategy &= ~STRAT_WAITMASK;
	    mtmp->mpeaceful = FALSE;
	}
}